

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O1

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit
          (link_uniform_block_active_visitor *this,ir_dereference_variable *ir)

{
  undefined1 *puVar1;
  char cVar2;
  ir_variable *var;
  glsl_type *pgVar3;
  link_uniform_block_active *plVar4;
  glsl_type *t;
  ir_visitor_status iVar5;
  
  var = ir->var;
  iVar5 = visit_continue;
  if (var->interface_type != (glsl_type *)0x0 && (*(uint *)&var->data >> 0xc & 0xf) - 1 < 2) {
    pgVar3 = var->type;
    puVar1 = &pgVar3->field_0x4;
    cVar2 = *puVar1;
    while (cVar2 == '\x11') {
      pgVar3 = (pgVar3->fields).array;
      cVar2 = pgVar3->field_0x4;
    }
    if (pgVar3 == var->interface_type && *puVar1 == '\x11') {
      __assert_fail("!var->is_interface_instance() || !var->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                    ,0x115,
                    "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                   );
    }
    plVar4 = process_block(this->mem_ctx,this->ht,var);
    if (plVar4 == (link_uniform_block_active *)0x0) {
      linker_error(this->prog,"uniform block `%s\' has mismatching definitions",
                   var->interface_type->name);
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      iVar5 = visit_stop;
    }
    else {
      if (plVar4->array != (uniform_block_array_elements *)0x0) {
        __assert_fail("b->array == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x122,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
      iVar5 = visit_continue;
      if (plVar4->type == (glsl_type *)0x0) {
        __assert_fail("b->type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x123,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
    }
  }
  return iVar5;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit(ir_dereference_variable *ir)
{
   ir_variable *var = ir->var;

   if (!var->is_in_buffer_block())
      return visit_continue;

   assert(!var->is_interface_instance() || !var->type->is_array());

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(this->prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   assert(b->array == NULL);
   assert(b->type != NULL);

   return visit_continue;
}